

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O1

void __thiscall Dashel::SocketStream::flush(SocketStream *this)

{
  flush((SocketStream *)
        ((long)&(this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream +
        (long)(this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream[-5]))
  ;
  return;
}

Assistant:

virtual void flush()
		{
			assert(fd >= 0);

#ifdef TCP_CORK
			int flag = 0;
			setsockopt(fd, IPPROTO_TCP, TCP_CORK, &flag, sizeof(flag));
			flag = 1;
			setsockopt(fd, IPPROTO_TCP, TCP_CORK, &flag, sizeof(flag));
#else
			send(sendBuffer.get(), sendBuffer.size());
			sendBuffer.clear();
#endif
		}